

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jtalk.c
# Opt level: O3

OPENJTALK_OS openjtalk_getOS(OpenJTalk *oj)

{
  return OPENJTALK_OS_LINUX;
}

Assistant:

OPENJTALK_CONVENTION openjtalk_getOS(OpenJTalk *oj)
{
#if defined(_WIN32)
	return OPENJTALK_OS_WINDOWS;
#elif defined(__APPLE__)
#if TARGET_OS_IPHONE
	return OPENJTALK_OS_IPHONE;
#else
	return OPENJTALK_OS_OSX;
#endif
#elif defined(__linux)
	return OPENJTALK_OS_LINUX;
#else
	return OPENJTALK_OS_OTHER;
#endif
}